

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O2

bool __thiscall
GlobOpt::TryOptConstFoldBrFalse(GlobOpt *this,Instr *instr,Value *srcValue,int32 min,int32 max)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  OpCode OVar4;
  ValueType *this_00;
  
  if (instr == (Instr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x27da,"(instr)","instr");
    if (!bVar2) goto LAB_004392c6;
    *puVar3 = 0;
  }
  if ((instr->m_opcode & ~ExtendedOpcodePrefix) != BrFalse_A) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x27db,
                       "(instr->m_opcode == Js::OpCode::BrFalse_A || instr->m_opcode == Js::OpCode::BrTrue_A)"
                       ,
                       "instr->m_opcode == Js::OpCode::BrFalse_A || instr->m_opcode == Js::OpCode::BrTrue_A"
                      );
    if (!bVar2) goto LAB_004392c6;
    *puVar3 = 0;
  }
  if (srcValue == (Value *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x27dc,"(srcValue)","srcValue");
    if (!bVar2) {
LAB_004392c6:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  this_00 = &srcValue->valueInfo->super_ValueType;
  if ((this->field_0xf5 & 2) == 0) {
    bVar2 = ValueType::IsInt(this_00);
  }
  else {
    bVar2 = ValueType::IsLikelyInt(this_00);
  }
  if (bVar2 == false) {
    bVar2 = false;
  }
  else {
    bVar2 = ValueInfo::IsEqualTo(srcValue,min,max,(Value *)0x0,0,0);
    OVar4 = BrFalse_A;
    if (!bVar2) {
      bVar2 = ValueInfo::IsNotEqualTo(srcValue,min,max,(Value *)0x0,0,0);
      OVar4 = BrTrue_A;
      if (!bVar2) {
        return false;
      }
    }
    OptConstFoldBr(this,instr->m_opcode == OVar4,instr,srcValue,(Value *)0x0);
    bVar2 = true;
  }
  return bVar2;
}

Assistant:

bool
GlobOpt::TryOptConstFoldBrFalse(
    IR::Instr *const instr,
    Value *const srcValue,
    const int32 min,
    const int32 max)
{
    Assert(instr);
    Assert(instr->m_opcode == Js::OpCode::BrFalse_A || instr->m_opcode == Js::OpCode::BrTrue_A);
    Assert(srcValue);

    if(!(DoAggressiveIntTypeSpec() ? srcValue->GetValueInfo()->IsLikelyInt() : srcValue->GetValueInfo()->IsInt()))
    {
        return false;
    }
    if(ValueInfo::IsEqualTo(srcValue, min, max, nullptr, 0, 0))
    {
        OptConstFoldBr(instr->m_opcode == Js::OpCode::BrFalse_A, instr, srcValue);
        return true;
    }
    if(ValueInfo::IsNotEqualTo(srcValue, min, max, nullptr, 0, 0))
    {
        OptConstFoldBr(instr->m_opcode == Js::OpCode::BrTrue_A, instr, srcValue);
        return true;
    }
    return false;
}